

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSources::SenderTimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  RTPInternalSourceData *pRVar2;
  HashElement *pHVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  
  dVar9 = curtime->m_t - timeoutdelay->m_t;
  pHVar3 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar3;
  if (pHVar3 == (HashElement *)0x0) {
    iVar4 = 0;
    iVar5 = 0;
    iVar6 = 0;
  }
  else {
    iVar7 = this->sendercount;
    iVar6 = 0;
    iVar5 = 0;
    iVar4 = 0;
    do {
      pRVar2 = pHVar3->element;
      uVar8 = (pRVar2->super_RTPSourceData).receivedbye ^ 1;
      if ((pRVar2->super_RTPSourceData).validated == false) {
        uVar8 = 0;
      }
      if ((pRVar2->super_RTPSourceData).issender == true) {
        pRVar1 = &(pRVar2->super_RTPSourceData).stats.lastrtptime;
        if (dVar9 < pRVar1->m_t || dVar9 == pRVar1->m_t) {
          iVar4 = iVar4 + 1;
        }
        else {
          (pRVar2->super_RTPSourceData).issender = false;
          iVar7 = iVar7 + -1;
          this->sendercount = iVar7;
        }
      }
      iVar5 = iVar5 + uVar8;
      pHVar3 = pHVar3->listnext;
      (this->sourcelist).curhashelem = pHVar3;
      iVar6 = iVar6 + 1;
    } while (pHVar3 != (HashElement *)0x0);
  }
  this->totalcount = iVar6;
  this->sendercount = iVar4;
  this->activecount = iVar5;
  return;
}

Assistant:

void RTPSources::SenderTimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();

		newtotalcount++;
		if (srcdat->IsActive())
			newactivecount++;

		if (srcdat->IsSender())
		{
			RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

			if (lastrtppacktime < checktime) // timeout
			{
				srcdat->ClearSenderFlag();
				sendercount--;
			}
			else
				newsendercount++;
		}
		sourcelist.GotoNextElement();
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}